

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O2

int32_t ucnv_internalConvert
                  (UConverter *outConverter,UConverter *inConverter,char *target,
                  int32_t targetCapacity,char *source,int32_t sourceLength,UErrorCode *pErrorCode)

{
  ulong uVar1;
  int32_t iVar2;
  char *myTarget;
  int32_t local_c6c;
  UChar *pivot2;
  UChar *pivot;
  char *source_local;
  char *local_c50;
  UConverter *local_c48;
  UConverter *local_c40;
  char targetBuffer [1024];
  UChar pivotBuffer [1024];
  UChar local_38 [4];
  
  source_local = source;
  if (sourceLength < 0) {
    uVar1 = strlen(source);
  }
  else {
    uVar1 = (ulong)(uint)sourceLength;
  }
  if (uVar1 != 0) {
    pivot2 = pivotBuffer;
    pivot = pivotBuffer;
    local_c48 = outConverter;
    local_c40 = inConverter;
    if (targetCapacity < 1) {
      iVar2 = 0;
    }
    else {
      myTarget = target;
      ucnv_convertEx_63(outConverter,inConverter,&myTarget,target + (uint)targetCapacity,
                        &source_local,source + uVar1,pivotBuffer,&pivot,&pivot2,local_38,'\0','\x01'
                        ,pErrorCode);
      iVar2 = (int)myTarget - (int)target;
    }
    if ((targetCapacity == 0) || (*pErrorCode == U_BUFFER_OVERFLOW_ERROR)) {
      local_c6c = targetCapacity;
      local_c50 = target;
      do {
        *pErrorCode = U_ZERO_ERROR;
        myTarget = targetBuffer;
        ucnv_convertEx_63(local_c48,local_c40,&myTarget,(char *)pivotBuffer,&source_local,
                          source + uVar1,pivotBuffer,&pivot,&pivot2,local_38,'\0','\x01',pErrorCode)
        ;
        iVar2 = iVar2 + ((int)myTarget - (int)targetBuffer);
      } while (*pErrorCode == U_BUFFER_OVERFLOW_ERROR);
      iVar2 = u_terminateChars_63(local_c50,local_c6c,iVar2,pErrorCode);
    }
    return iVar2;
  }
  iVar2 = u_terminateChars_63(target,targetCapacity,0,pErrorCode);
  return iVar2;
}

Assistant:

static int32_t
ucnv_internalConvert(UConverter *outConverter, UConverter *inConverter,
                     char *target, int32_t targetCapacity,
                     const char *source, int32_t sourceLength,
                     UErrorCode *pErrorCode) {
    UChar pivotBuffer[CHUNK_SIZE];
    UChar *pivot, *pivot2;

    char *myTarget;
    const char *sourceLimit;
    const char *targetLimit;
    int32_t targetLength=0;

    /* set up */
    if(sourceLength<0) {
        sourceLimit=uprv_strchr(source, 0);
    } else {
        sourceLimit=source+sourceLength;
    }

    /* if there is no input data, we're done */
    if(source==sourceLimit) {
        return u_terminateChars(target, targetCapacity, 0, pErrorCode);
    }

    pivot=pivot2=pivotBuffer;
    myTarget=target;
    targetLength=0;

    if(targetCapacity>0) {
        /* perform real conversion */
        targetLimit=target+targetCapacity;
        ucnv_convertEx(outConverter, inConverter,
                       &myTarget, targetLimit,
                       &source, sourceLimit,
                       pivotBuffer, &pivot, &pivot2, pivotBuffer+CHUNK_SIZE,
                       FALSE,
                       TRUE,
                       pErrorCode);
        targetLength=(int32_t)(myTarget-target);
    }

    /*
     * If the output buffer is exhausted (or we are only "preflighting"), we need to stop writing
     * to it but continue the conversion in order to store in targetCapacity
     * the number of bytes that was required.
     */
    if(*pErrorCode==U_BUFFER_OVERFLOW_ERROR || targetCapacity==0)
    {
        char targetBuffer[CHUNK_SIZE];

        targetLimit=targetBuffer+CHUNK_SIZE;
        do {
            *pErrorCode=U_ZERO_ERROR;
            myTarget=targetBuffer;
            ucnv_convertEx(outConverter, inConverter,
                           &myTarget, targetLimit,
                           &source, sourceLimit,
                           pivotBuffer, &pivot, &pivot2, pivotBuffer+CHUNK_SIZE,
                           FALSE,
                           TRUE,
                           pErrorCode);
            targetLength+=(int32_t)(myTarget-targetBuffer);
        } while(*pErrorCode==U_BUFFER_OVERFLOW_ERROR);

        /* done with preflighting, set warnings and errors as appropriate */
        return u_terminateChars(target, targetCapacity, targetLength, pErrorCode);
    }

    /* no need to call u_terminateChars() because ucnv_convertEx() took care of that */
    return targetLength;
}